

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O2

void __thiscall
wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::CallPrinter(wasm::Module__
          (void *this,Module *module)

{
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(Module **)((long)this + 0xd8) = module;
  *(undefined4 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(long *)((long)this + 0x100) = (long)this + 0xf0;
  *(long *)((long)this + 0x108) = (long)this + 0xf0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::CallPrinter(wasm::Module*)::_lambda(wasm::Function*)_1_>
            (module,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

CallPrinter(Module* module) : module(module) {
        // Walk function bodies.
        ModuleUtils::iterDefinedFunctions(*module, [&](Function* curr) {
          currFunction = curr;
          visitedTargets.clear();
          walk(curr->body);
        });
      }